

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
           *this,Boxed_Value *param)

{
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Type_Conversions_State state;
  Boxed_Value *in_stack_fffffffffffffe38;
  Conversion_Saves *in_stack_fffffffffffffe40;
  Type_Conversions *in_stack_fffffffffffffe48;
  Type_Conversions_State *in_stack_fffffffffffffe50;
  allocator_type *in_stack_fffffffffffffe68;
  undefined1 **ppuVar3;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
  *in_stack_fffffffffffffe70;
  undefined1 **ppuVar4;
  iterator in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  undefined1 *puVar5;
  undefined1 **local_128;
  undefined1 local_da;
  undefined1 local_d9;
  Type_Conversions_State *in_stack_ffffffffffffff38;
  Type_Conversions_State *t_conversions;
  reference_wrapper<const_chaiscript::Type_Conversions> in_stack_ffffffffffffff40;
  reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> in_stack_ffffffffffffff48;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_85;
  undefined8 *local_68;
  undefined1 *local_60 [2];
  undefined8 *local_50;
  undefined8 local_48;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    local_d9 = 1;
    t_conversions = (Type_Conversions_State *)&stack0xffffffffffffff40;
    Boxed_Value::Boxed_Value((Boxed_Value *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    box<chaiscript::Boxed_Value_const&>(in_stack_fffffffffffffe38);
    local_d9 = 0;
    local_b0 = &stack0xffffffffffffff40;
    local_a8 = 1;
    puVar5 = &local_da;
    std::allocator<chaiscript::Boxed_Value>::allocator
              ((allocator<chaiscript::Boxed_Value> *)0x33f091);
    __l_00._M_len = (size_type)puVar5;
    __l_00._M_array = in_stack_fffffffffffffe78;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (in_stack_fffffffffffffe70,__l_00,in_stack_fffffffffffffe68);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)in_stack_ffffffffffffff48._M_data,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff40._M_data,t_conversions);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffe50);
    std::allocator<chaiscript::Boxed_Value>::~allocator
              ((allocator<chaiscript::Boxed_Value> *)0x33f0ef);
    ppuVar4 = (undefined1 **)&stack0xffffffffffffff40;
    ppuVar3 = &local_b0;
    do {
      ppuVar3 = ppuVar3 + -2;
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x33f118);
    } while (ppuVar3 != ppuVar4);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x33f139);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    Type_Conversions::conversion_saves((Type_Conversions *)0x33ed76);
    Type_Conversions_State::Type_Conversions_State
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    local_85 = 1;
    local_68 = local_60;
    Boxed_Value::Boxed_Value((Boxed_Value *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    box<chaiscript::Boxed_Value_const&>(in_stack_fffffffffffffe38);
    local_85 = 0;
    local_50 = local_60;
    local_48 = 1;
    std::allocator<chaiscript::Boxed_Value>::allocator
              ((allocator<chaiscript::Boxed_Value> *)0x33ee2b);
    __l._M_len = in_stack_fffffffffffffe80;
    __l._M_array = in_stack_fffffffffffffe78;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (in_stack_fffffffffffffe70,__l,in_stack_fffffffffffffe68);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)in_stack_ffffffffffffff48._M_data,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_ffffffffffffff40._M_data,in_stack_ffffffffffffff38);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffe50);
    std::allocator<chaiscript::Boxed_Value>::~allocator
              ((allocator<chaiscript::Boxed_Value> *)0x33ee93);
    local_128 = (undefined1 **)&local_50;
    do {
      local_128 = local_128 + -2;
      Boxed_Value::~Boxed_Value((Boxed_Value *)0x33eec8);
    } while (local_128 != local_60);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x33eef2);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P&&  ...  param)
          {
            if (m_conversions) {
              Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, &state
                  );
            } else {
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, nullptr
                  );
            }

          }